

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int spki_table_src_remove(spki_table *spki_table,rtr_socket *socket)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  void *ptr;
  tommy_list ptVar3;
  void *pvVar4;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  ptVar3 = spki_table->list;
LAB_00102f01:
  do {
    if (ptVar3 == (tommy_list)0x0) {
      iVar5 = 0;
LAB_00102f52:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
        return iVar5;
      }
      __stack_chk_fail();
    }
    ptVar2 = ptVar3->next;
    ptr = ptVar3->data;
    ptVar3 = ptVar2;
  } while (*(rtr_socket **)((long)ptr + 0x78) != socket);
  pvVar4 = tommy_list_remove_existing(&spki_table->list,(tommy_node *)((long)ptr + 0xa0));
  if (pvVar4 != (void *)0x0) {
    pvVar4 = tommy_hashlin_remove_existing
                       (&spki_table->hashtable,(tommy_hashlin_node *)((long)ptr + 0x80));
    if (pvVar4 != (void *)0x0) {
      lrtr_free(ptr);
      goto LAB_00102f01;
    }
  }
  iVar5 = -1;
  goto LAB_00102f52;
}

Assistant:

int spki_table_src_remove(struct spki_table *spki_table, const struct rtr_socket *socket)
{
	struct key_entry *entry;
	tommy_node *current_node;

	pthread_rwlock_wrlock(&spki_table->lock);

	current_node = tommy_list_head(&spki_table->list);
	while (current_node) {
		entry = current_node->data;
		if (entry->socket == socket) {
			current_node = current_node->next;
			if (!tommy_list_remove_existing(&spki_table->list, &entry->list_node)) {
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			if (!tommy_hashlin_remove_existing(&spki_table->hashtable, &entry->hash_node)) {
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			lrtr_free(entry);
		} else {
			current_node = current_node->next;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}